

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.hpp
# Opt level: O1

IterTraits<Lib::MappingIterator<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:216:22),_Kernel::SelectedSummand>_>
* __thiscall
Kernel::AlascaState::maxSummands
          (IterTraits<Lib::MappingIterator<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:216:22),_Kernel::SelectedSummand>_>
           *__return_storage_ptr__,AlascaState *this,SelectedLiteral *sel_lit,SelectionCriterion sel
          )

{
  MaybeUninit<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  *this_00;
  undefined4 uVar1;
  undefined8 uVar2;
  anon_class_16_2_d708292f f;
  SelectionCriterion local_164;
  anon_class_48_1_f93f0412_for__func local_160;
  anon_class_16_2_633bab87 local_130;
  IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>_>
  local_120;
  RawCoproduct<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>
  local_9c;
  Coproduct<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>
  *is;
  
  local_130.sel = &local_164;
  this_00 = &(sel_lit->interpreted).
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem;
  f.this = (Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
            *)this_00;
  f.f = &local_130;
  local_164 = sel;
  local_130.this = this;
  ::Lib::CoproductImpl::
  RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  ::
  switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
            ((ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict7
              *)&local_9c,
             (RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
              *)this_00,f);
  ::Lib::
  coproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int,unsigned_int)_1_,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int)_1_>(unsigned_int,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(unsigned_int,unsigned_int)_1_,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Ker___l::RealConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::_lambda(auto:1&)_1_,false>>>
            (&local_120,(Lib *)&local_9c,is);
  local_160.sel_lit.litIdx = sel_lit->litIdx;
  local_160.sel_lit.cl = sel_lit->cl;
  local_160.sel_lit.interpreted.
  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ._isSome = (sel_lit->interpreted).
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._isSome;
  if (local_160.sel_lit.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._isSome == true) {
    local_160.sel_lit.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._21_7_ = 0;
    local_160.sel_lit.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._0_5_ =
         *(uint5 *)&(sel_lit->interpreted).
                    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ._elem._elem & 0xffffffff03;
    local_160.sel_lit.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._5_3_ = 0;
    uVar2 = *(undefined8 *)
             ((long)&(sel_lit->interpreted).
                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     ._elem._elem + 9);
    local_160.sel_lit.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._9_3_ = (undefined3)uVar2;
    local_160.sel_lit.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._8_4_ =
         (uint)(uint3)local_160.sel_lit.interpreted.
                      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      ._elem._elem._9_3_ << 8;
    local_160.sel_lit.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._12_4_ = (undefined4)((ulong)uVar2 >> 0x18);
    local_160.sel_lit.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0xf] = (char)((ulong)uVar2 >> 0x38);
    uVar1 = *(undefined4 *)
             ((long)&(sel_lit->interpreted).
                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     ._elem._elem + 0x11);
    local_160.sel_lit.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._17_3_ = (undefined3)uVar1;
    local_160.sel_lit.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0x13] = (char)((uint)uVar1 >> 0x18);
  }
  ::Lib::
  IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1}>(unsigned_int,Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxSummandIndices<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::A...::RealConstantType>>const&,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1&)#1},false>>>>
  ::
  map<Kernel::AlascaState::maxSummands(Kernel::SelectedLiteral,Kernel::OrderingUtils::SelectionCriterion)::_lambda(auto:1)_1_>
            (__return_storage_ptr__,&local_120,&local_160);
  ::Lib::CoproductImpl::
  RawCoproduct<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>_>
  ::
  switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:201:25)>
            ((RawCoproduct<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:107:26),_false>_>_>
              *)&local_120,(anon_class_8_1_8991fb9c)&local_120);
  ::Lib::CoproductImpl::
  RawCoproduct<Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>,_Lib::IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:107:26),_false>_>_>
  ::
  switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:201:25)>
            (&local_9c,(anon_class_8_1_8991fb9c)&local_9c);
  return __return_storage_ptr__;
}

Assistant:

auto maxSummands(SelectedLiteral sel_lit , SelectionCriterion sel) 
    { return coproductIter(sel_lit.interpreted.unwrap()
                .applyCo([&](auto& lit) 
                       { return maxSummandIndices(lit, sel); }))
                .map([=](auto i) 
                     { return SelectedSummand(sel_lit, i); }); }